

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void on_nes_audio(nes_audio_output *audio,void *client)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  int16_t resample_buf [512];
  int16_t local_428 [516];
  
  SDL_LockAudioDevice(audio_device_id);
  fVar5 = 44100.0 / (float)audio->sample_rate;
  if (3.0 < ABS(60.0 - latency_avg)) {
    fVar4 = ABS(60.0 - latency_avg) / 44100.0;
    if (60.0 <= latency_avg) {
      fVar5 = fVar5 - fVar4;
    }
    else {
      fVar5 = fVar5 + fVar4;
    }
  }
  uVar1 = audio->sample_count;
  if (uVar1 != 0) {
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (1.0 <= audio_counter) {
        audio_counter = audio_counter + -1.0;
        local_428[uVar2] = audio->samples[uVar3];
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      audio_counter = audio_counter + fVar5;
      if ((int)uVar2 == 0x200) {
        ring_buf_write(&audio_ring_buf,local_428,0x400);
        uVar1 = audio->sample_count;
        uVar2 = 0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
    if ((int)uVar2 != 0) {
      ring_buf_write(&audio_ring_buf,local_428,uVar2 * 2);
    }
  }
  SDL_UnlockAudioDevice(audio_device_id);
  return;
}

Assistant:

void on_nes_audio(const nes_audio_output* audio, void* client)
{
    int16_t resample_buf[512];
    uint32_t dst = 0;

    SDL_LockAudioDevice(audio_device_id);

    const float target_latency = 60.f;
    float increment_rate = (float)SAMPLE_RATE / (float)audio->sample_rate;

    float diff = fabsf(target_latency - latency_avg);
    if (diff > 3.0f)
    {
        if (latency_avg < target_latency)
            increment_rate += diff / (float)SAMPLE_RATE;
        else
            increment_rate -= diff / (float)SAMPLE_RATE;
    }

    for (uint32_t src = 0; src < audio->sample_count; ++src)
    {
        if (audio_counter >= 1.0f)
        {
            audio_counter -= 1.0f;
            resample_buf[dst++] = audio->samples[src];
        }
        audio_counter += increment_rate;

        if (dst == 512)
        {
            ring_buf_write(&audio_ring_buf, resample_buf, dst * sizeof(int16_t));
            dst = 0;
        }
    }

    if (dst)
        ring_buf_write(&audio_ring_buf, resample_buf, dst * sizeof(int16_t));

    SDL_UnlockAudioDevice(audio_device_id);
}